

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O3

OnDiskIterator * OnDiskIterator::load(OnDiskIterator *__return_storage_ptr__,DatabaseName *name)

{
  _Alloc_hider byte_offset;
  _Alloc_hider file_offset;
  reference pvVar1;
  json j;
  unsigned_long ret_3;
  DatabaseName datafile_name;
  ifstream in;
  undefined1 local_328 [8];
  json_value local_320;
  long *local_318 [2];
  long local_308 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  DatabaseName local_2d8;
  istream local_238 [520];
  
  DatabaseName::get_full_path_abi_cxx11_(&local_2d8.db_base,name);
  std::ifstream::ifstream(local_238,local_2d8.db_base._M_pathname._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2d8.db_base);
  local_328[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  )0x0;
  local_320.object = (object_t *)0x0;
  nlohmann::operator>>
            (local_238,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_328);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_328,"byte_offset");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
            (pvVar1,(unsigned_long *)&local_2d8);
  byte_offset._M_p = local_2d8.db_base._M_pathname._M_dataplus._M_p;
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_328,"file_offset");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
            (pvVar1,(unsigned_long *)&local_2d8);
  file_offset._M_p = local_2d8.db_base._M_pathname._M_dataplus._M_p;
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_328,"total_files");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
            (pvVar1,(unsigned_long *)&local_2d8);
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"iterator","");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_328,"backing_storage");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2f8,pvVar1);
  DatabaseName::derive(&local_2d8,(EVP_PKEY_CTX *)name,(uchar *)local_318,(size_t *)&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_328,"last_read_timestamp");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
            (pvVar1,(unsigned_long *)local_318);
  OnDiskIterator(__return_storage_ptr__,name,&local_2d8,
                 (uint64_t)local_2d8.db_base._M_pathname._M_dataplus._M_p,(uint64_t)byte_offset._M_p
                 ,(uint64_t)file_offset._M_p,(time_t)local_318[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.filename._M_dataplus._M_p != &local_2d8.filename.field_2) {
    operator_delete(local_2d8.filename._M_dataplus._M_p,
                    local_2d8.filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.id._M_dataplus._M_p != &local_2d8.id.field_2) {
    operator_delete(local_2d8.id._M_dataplus._M_p,local_2d8.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.type._M_dataplus._M_p != &local_2d8.type.field_2) {
    operator_delete(local_2d8.type._M_dataplus._M_p,local_2d8.type.field_2._M_allocated_capacity + 1
                   );
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2d8.db_base);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_328 + 8),(value_t)local_328[0]);
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

OnDiskIterator OnDiskIterator::load(const DatabaseName &name) {
    std::ifstream in(name.get_full_path(), std::ifstream::binary);
    json j;
    in >> j;

    uint64_t byte_offset = j["byte_offset"];
    uint64_t file_offset = j["file_offset"];
    uint64_t total_files = j["total_files"];
    auto datafile_name = name.derive("iterator", j["backing_storage"]);
    uint64_t last_read_timestamp = j["last_read_timestamp"];

    return OnDiskIterator(name, datafile_name, total_files, byte_offset,
                          file_offset, last_read_timestamp);
}